

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsgStatement.cpp
# Opt level: O1

float rsg::DeclarationStatement::getWeight(GeneratorState *state)

{
  Storage SVar1;
  pointer ppVVar2;
  vector<rsg::Variable_*,_std::allocator<rsg::Variable_*>_> *pvVar3;
  Statement *pSVar4;
  long lVar5;
  pointer ppVVar6;
  bool bVar7;
  float fVar8;
  
  pvVar3 = VariableManager::getLiveVariables(state->m_varManager);
  ppVVar6 = (pvVar3->super__Vector_base<rsg::Variable_*,_std::allocator<rsg::Variable_*>_>)._M_impl.
            super__Vector_impl_data._M_start;
  ppVVar2 = (pvVar3->super__Vector_base<rsg::Variable_*,_std::allocator<rsg::Variable_*>_>)._M_impl.
            super__Vector_impl_data._M_finish;
  bVar7 = ppVVar6 != ppVVar2;
  if (bVar7) {
    SVar1 = (*ppVVar6)->m_storage;
    while (SVar1 != STORAGE_LOCAL) {
      ppVVar6 = ppVVar6 + 1;
      bVar7 = ppVVar6 != ppVVar2;
      if (ppVVar6 == ppVVar2) break;
      SVar1 = (*ppVVar6)->m_storage;
    }
  }
  fVar8 = 0.0;
  if (bVar7) {
    pSVar4 = GeneratorState::getStatementStackEntry
                       (state,(int)((ulong)((long)(state->m_statementStack->
                                                  super__Vector_base<rsg::Statement_*,_std::allocator<rsg::Statement_*>_>
                                                  )._M_impl.super__Vector_impl_data._M_finish -
                                           (long)(state->m_statementStack->
                                                 super__Vector_base<rsg::Statement_*,_std::allocator<rsg::Statement_*>_>
                                                 )._M_impl.super__Vector_impl_data._M_start) >> 3) +
                              -1);
    if (pSVar4 == (Statement *)0x0) {
      fVar8 = 0.0;
    }
    else {
      lVar5 = __dynamic_cast(pSVar4,&Statement::typeinfo,&BlockStatement::typeinfo,0);
      fVar8 = 0.0;
      if (lVar5 != 0) {
        fVar8 = (float)(int)state->m_programParams->declarationStatementBaseWeight;
      }
    }
  }
  return fVar8;
}

Assistant:

float DeclarationStatement::getWeight (const GeneratorState& state)
{
	if (!hasDeclarableVars(state.getVariableManager()))
		return 0.0f;

	if (!isCurrentTopStatementBlock(state))
		return 0.0f;

	return state.getProgramParameters().declarationStatementBaseWeight;
}